

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

bool comparesEqual(QDir *lhs,QDir *rhs)

{
  QDirPrivate *this;
  QDirPrivate *this_00;
  QAbstractFileEngine *pQVar1;
  QAbstractFileEngine *pQVar2;
  byte bVar3;
  compare_eq_result_container<QList<QString>,_QString> cVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this = (lhs->d_ptr).d.ptr;
  this_00 = (rhs->d_ptr).d.ptr;
  bVar6 = true;
  if (this == this_00) goto LAB_00213ebf;
  pQVar1 = (this->fileEngine)._M_t.
           super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>.
           _M_t.
           super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
           super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl;
  pQVar2 = (this_00->fileEngine)._M_t.
           super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>.
           _M_t.
           super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
           super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl;
  if (pQVar1 == (QAbstractFileEngine *)0x0) {
    if (pQVar2 == (QAbstractFileEngine *)0x0) {
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QOrderedMutexLocker::QOrderedMutexLocker
                ((QOrderedMutexLocker *)&local_58,(QBasicMutex *)&this->fileCache,
                 (QBasicMutex *)&this_00->fileCache);
      bVar3 = QFileSystemEngine::isCaseSensitive(&this->dirEntry,&(this->fileCache).metaData);
      bVar5 = QFileSystemEngine::isCaseSensitive(&this_00->dirEntry,&(this_00->fileCache).metaData);
      QOrderedMutexLocker::unlock((QOrderedMutexLocker *)&local_58);
      if ((bool)bVar3 == bVar5) goto LAB_00213dfd;
    }
  }
  else if (pQVar2 != (QAbstractFileEngine *)0x0) {
    iVar7 = (*pQVar1->_vptr_QAbstractFileEngine[0x12])();
    iVar8 = (*((this_00->fileEngine)._M_t.
               super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
               ._M_t.
               super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
               .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl)->
              _vptr_QAbstractFileEngine[0x12])();
    if ((char)iVar7 == (char)iVar8) {
      iVar7 = (*((this->fileEngine)._M_t.
                 super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
                 .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl)->
                _vptr_QAbstractFileEngine[0x12])();
      bVar3 = (byte)iVar7;
LAB_00213dfd:
      if (((this->filters).super_QFlagsStorageHelper<QDir::Filter,_4>.
           super_QFlagsStorage<QDir::Filter>.i ==
           (this_00->filters).super_QFlagsStorageHelper<QDir::Filter,_4>.
           super_QFlagsStorage<QDir::Filter>.i) &&
         ((this->sort).super_QFlagsStorageHelper<QDir::SortFlag,_4>.
          super_QFlagsStorage<QDir::SortFlag>.i ==
          (this_00->sort).super_QFlagsStorageHelper<QDir::SortFlag,_4>.
          super_QFlagsStorage<QDir::SortFlag>.i)) {
        cVar4 = QList<QString>::operator==(&this->nameFilters,&this_00->nameFilters);
        if (cVar4) {
          QFileSystemEntry::filePath((QString *)&local_58,&this->dirEntry);
          QFileSystemEntry::filePath((QString *)&local_78,&this_00->dirEntry);
          bVar5 = comparesEqual((QString *)&local_58,(QString *)&local_78);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
          if (bVar5) goto LAB_00213ebf;
          bVar6 = QDir::exists(lhs);
          bVar5 = QDir::exists(rhs);
          if (bVar6) {
            if (!bVar5) goto LAB_00213ebd;
            QDir::canonicalPath((QString *)&local_58,lhs);
            QDir::canonicalPath((QString *)&local_78,rhs);
          }
          else {
            if (bVar5) goto LAB_00213ebd;
            local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            QDirPrivate::resolveAbsoluteEntry((QString *)&local_58,this);
            local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            QDirPrivate::resolveAbsoluteEntry((QString *)&local_78,this_00);
          }
          iVar7 = QString::compare((QString *)&local_58,(QString *)&local_78,(uint)bVar3);
          bVar6 = iVar7 == 0;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
          goto LAB_00213ebf;
        }
      }
    }
  }
LAB_00213ebd:
  bVar6 = false;
LAB_00213ebf:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool comparesEqual(const QDir &lhs, const QDir &rhs)
{
    const QDirPrivate *d = lhs.d_ptr.constData();
    const QDirPrivate *other = rhs.d_ptr.constData();

    if (d == other)
        return true;
    Qt::CaseSensitivity sensitive;
    if (!d->fileEngine || !other->fileEngine) {
        if (d->fileEngine.get() != other->fileEngine.get()) // one is native, the other is a custom file-engine
            return false;

        QOrderedMutexLocker locker(&d->fileCache.mutex, &other->fileCache.mutex);
        const bool thisCaseSensitive = QFileSystemEngine::isCaseSensitive(d->dirEntry, d->fileCache.metaData);
        if (thisCaseSensitive != QFileSystemEngine::isCaseSensitive(other->dirEntry, other->fileCache.metaData))
            return false;

        sensitive = thisCaseSensitive ? Qt::CaseSensitive : Qt::CaseInsensitive;
    } else {
        if (d->fileEngine->caseSensitive() != other->fileEngine->caseSensitive())
            return false;
        sensitive = d->fileEngine->caseSensitive() ? Qt::CaseSensitive : Qt::CaseInsensitive;
    }

    if (d->filters == other->filters
       && d->sort == other->sort
       && d->nameFilters == other->nameFilters) {

        // Assume directories are the same if path is the same
        if (d->dirEntry.filePath() == other->dirEntry.filePath())
            return true;

        if (lhs.exists()) {
            if (!rhs.exists())
                return false; //can't be equal if only one exists
            // Both exist, fallback to expensive canonical path computation
            return lhs.canonicalPath().compare(rhs.canonicalPath(), sensitive) == 0;
        } else {
            if (rhs.exists())
                return false; //can't be equal if only one exists
            // Neither exists, compare absolute paths rather than canonical (which would be empty strings)
            QString thisFilePath = d->resolveAbsoluteEntry();
            QString otherFilePath = other->resolveAbsoluteEntry();
            return thisFilePath.compare(otherFilePath, sensitive) == 0;
        }
    }
    return false;
}